

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HullFinder.cpp
# Opt level: O0

void __thiscall OpenMD::HullFinder::~HullFinder(HullFinder *this)

{
  vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)unaff_retaddr)
  ;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::~vector
            ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)unaff_retaddr);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::~vector
            ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)unaff_retaddr);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::~vector
            ((vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *)unaff_retaddr);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::~vector(unaff_retaddr);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::~vector
            ((vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *)unaff_retaddr);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)unaff_retaddr)
  ;
  return;
}

Assistant:

HullFinder::~HullFinder() {
#ifdef HAVE_QHULL
    delete surfaceMesh_;
#endif
  }